

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_filters.cpp
# Opt level: O0

short __thiscall DSDcc::DSDFilters::dmr_filter(DSDFilters *this,short sample)

{
  short sVar1;
  short in_SI;
  DSDFilters *in_RDI;
  
  sVar1 = dsd_input_filter(in_RDI,in_SI,3);
  return sVar1;
}

Assistant:

short DSDFilters::dmr_filter(short sample) // all 4800 baud filters for now
{
    return dsd_input_filter(sample, 3);
}